

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall wabt::anon_unknown_78::BinaryReaderIR::OnMemorySizeExpr(BinaryReaderIR *this)

{
  unique_ptr<wabt::ExprMixin<(wabt::ExprType)32>,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)32>_>_>
  local_28;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_20;
  BinaryReaderIR *local_18;
  BinaryReaderIR *this_local;
  
  local_18 = this;
  MakeUnique<wabt::ExprMixin<(wabt::ExprType)32>>();
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::ExprMixin<(wabt::ExprType)32>,std::default_delete<wabt::ExprMixin<(wabt::ExprType)32>>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_20,&local_28);
  this_local._4_4_ = AppendExpr(this,&local_20);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_20);
  std::
  unique_ptr<wabt::ExprMixin<(wabt::ExprType)32>,_std::default_delete<wabt::ExprMixin<(wabt::ExprType)32>_>_>
  ::~unique_ptr(&local_28);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnMemorySizeExpr() {
  return AppendExpr(MakeUnique<MemorySizeExpr>());
}